

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

bool EqualNode::ParameterToLong(char *param,long *outResult)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  int __base;
  char *param_local;
  char *pEnd;
  
  cVar1 = *param;
  param_local = param;
  bVar2 = cmHasLiteralPrefix<char_const*,3ul>(&param_local,(char (*) [3])0x46f893);
  if ((bVar2) ||
     (bVar2 = cmHasLiteralPrefix<char_const*,3ul>(&param_local,(char (*) [3])0x46f897), bVar2)) {
    param_local = param_local + 2;
  }
  else {
    bVar2 = cmHasLiteralPrefix<char_const*,4ul>(&param_local,(char (*) [4])"-0b");
    if ((((!bVar2) &&
         (bVar2 = cmHasLiteralPrefix<char_const*,4ul>(&param_local,(char (*) [4])"-0B"), !bVar2)) &&
        (bVar2 = cmHasLiteralPrefix<char_const*,4ul>(&param_local,(char (*) [4])"+0b"), !bVar2)) &&
       (bVar2 = cmHasLiteralPrefix<char_const*,4ul>(&param_local,(char (*) [4])"+0B"), !bVar2)) {
      __base = 0;
      goto LAB_0030dfa2;
    }
    param_local = param_local + 3;
  }
  __base = 2;
LAB_0030dfa2:
  lVar3 = strtol(param_local,&pEnd,__base);
  if (((pEnd != param_local) && (*pEnd == '\0')) && (piVar4 = __errno_location(), *piVar4 != 0x22))
  {
    lVar5 = -lVar3;
    if (lVar3 < 1) {
      lVar5 = lVar3;
    }
    if (cVar1 != '-') {
      lVar5 = lVar3;
    }
    *outResult = lVar5;
    return true;
  }
  return false;
}

Assistant:

static bool ParameterToLong(const char* param, long* outResult)
  {
    const char isNegative = param[0] == '-';

    int base = 0;
    if (cmHasLiteralPrefix(param, "0b") || cmHasLiteralPrefix(param, "0B")) {
      base = 2;
      param += 2;
    } else if (cmHasLiteralPrefix(param, "-0b") ||
               cmHasLiteralPrefix(param, "-0B") ||
               cmHasLiteralPrefix(param, "+0b") ||
               cmHasLiteralPrefix(param, "+0B")) {
      base = 2;
      param += 3;
    }

    char* pEnd;
    long result = strtol(param, &pEnd, base);
    if (pEnd == param || *pEnd != '\0' || errno == ERANGE) {
      return false;
    }
    if (isNegative && result > 0) {
      result *= -1;
    }
    *outResult = result;
    return true;
  }